

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

void __thiscall
osc::ReceivedMessage::Init(ReceivedMessage *this,char *message,osc_bundle_element_size_t size)

{
  bool bVar1;
  uint32 uVar2;
  MalformedMessageException *pMVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ptrdiff_t argumentCount;
  uint32 local_64;
  undefined1 local_60 [4];
  uint32 blobSize;
  int local_4c;
  char *pcStack_48;
  uint arrayLevel;
  char *argument;
  char *typeTag;
  char *end;
  int local_1c;
  char *pcStack_18;
  osc_bundle_element_size_t size_local;
  char *message_local;
  ReceivedMessage *this_local;
  
  local_1c = size;
  pcStack_18 = message;
  message_local = (char *)this;
  bVar1 = IsValidElementSizeValue(size);
  if (!bVar1) {
    pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
    MalformedMessageException::MalformedMessageException(pMVar3,"invalid message size");
    __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                MalformedMessageException::~MalformedMessageException);
  }
  if (local_1c == 0) {
    pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
    MalformedMessageException::MalformedMessageException
              (pMVar3,"zero length messages not permitted");
    __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                MalformedMessageException::~MalformedMessageException);
  }
  bVar1 = IsMultipleOf4(local_1c);
  if (!bVar1) {
    pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
    MalformedMessageException::MalformedMessageException
              (pMVar3,"message size must be multiple of four");
    __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                MalformedMessageException::~MalformedMessageException);
  }
  typeTag = pcStack_18 + local_1c;
  pcVar4 = FindStr4End(this->addressPattern_,typeTag);
  this->typeTagsBegin_ = pcVar4;
  if (this->typeTagsBegin_ == (char *)0x0) {
    pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
    MalformedMessageException::MalformedMessageException(pMVar3,"unterminated address pattern");
    __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                MalformedMessageException::~MalformedMessageException);
  }
  if (this->typeTagsBegin_ == typeTag) {
    this->typeTagsBegin_ = (char *)0x0;
    this->typeTagsEnd_ = (char *)0x0;
    this->arguments_ = (char *)0x0;
  }
  else {
    if (*this->typeTagsBegin_ != ',') {
      pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
      MalformedMessageException::MalformedMessageException(pMVar3,"type tags not present");
      __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                  MalformedMessageException::~MalformedMessageException);
    }
    if (this->typeTagsBegin_[1] == '\0') {
      this->typeTagsBegin_ = (char *)0x0;
      this->typeTagsEnd_ = (char *)0x0;
      this->arguments_ = (char *)0x0;
    }
    else {
      pcVar4 = FindStr4End(this->typeTagsBegin_,typeTag);
      this->arguments_ = pcVar4;
      if (this->arguments_ == (char *)0x0) {
        pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
        MalformedMessageException::MalformedMessageException
                  (pMVar3,"type tags were not terminated before end of message");
        __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                    MalformedMessageException::~MalformedMessageException);
      }
      this->typeTagsBegin_ = this->typeTagsBegin_ + 1;
      pcStack_48 = this->arguments_;
      local_4c = 0;
      argument = this->typeTagsBegin_;
      do {
        switch(*argument) {
        case 'F':
        case 'I':
        case 'N':
        case 'T':
          break;
        default:
          pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
          MalformedMessageException::MalformedMessageException(pMVar3,"unknown type tag");
          __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                      MalformedMessageException::~MalformedMessageException);
        case 'S':
        case 's':
          if (pcStack_48 == typeTag) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"arguments exceed message size");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
          pcStack_48 = FindStr4End(pcStack_48,typeTag);
          if (pcStack_48 == (char *)0x0) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"unterminated string argument");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
          break;
        case '[':
          local_4c = local_4c + 1;
          break;
        case ']':
          local_4c = local_4c + -1;
          break;
        case 'b':
          if (typeTag < pcStack_48 + 4) {
            MalformedMessageException::MalformedMessageException
                      ((MalformedMessageException *)local_60,"arguments exceed message size");
            MalformedMessageException::~MalformedMessageException
                      ((MalformedMessageException *)local_60);
          }
          local_64 = ToUInt32(pcStack_48);
          pcVar4 = pcStack_48;
          uVar2 = RoundUp4(local_64);
          pcStack_48 = pcVar4 + (ulong)uVar2 + 4;
          if (typeTag < pcStack_48) {
            MalformedMessageException::MalformedMessageException
                      ((MalformedMessageException *)&argumentCount,"arguments exceed message size");
            MalformedMessageException::~MalformedMessageException
                      ((MalformedMessageException *)&argumentCount);
          }
          break;
        case 'c':
        case 'f':
        case 'i':
        case 'm':
        case 'r':
          if (pcStack_48 == typeTag) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"arguments exceed message size");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
          pcStack_48 = pcStack_48 + 4;
          if (typeTag < pcStack_48) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"arguments exceed message size");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
          break;
        case 'd':
        case 'h':
        case 't':
          if (pcStack_48 == typeTag) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"arguments exceed message size");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
          pcStack_48 = pcStack_48 + 8;
          if (typeTag < pcStack_48) {
            pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
            MalformedMessageException::MalformedMessageException
                      (pMVar3,"arguments exceed message size");
            __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                        MalformedMessageException::~MalformedMessageException);
          }
        }
        pcVar6 = argument + 1;
        pcVar4 = argument + 1;
        argument = pcVar6;
      } while (*pcVar4 != '\0');
      this->typeTagsEnd_ = pcVar6;
      if (local_4c != 0) {
        pMVar3 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
        MalformedMessageException::MalformedMessageException
                  (pMVar3,
                   "array was not terminated before end of message (expected \']\' end of array tag)"
                  );
        __cxa_throw(pMVar3,&MalformedMessageException::typeinfo,
                    MalformedMessageException::~MalformedMessageException);
      }
    }
    lVar5 = (long)this->typeTagsEnd_ - (long)this->typeTagsBegin_;
    if (lVar5 < 0) {
      __assert_fail("argumentCount >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/efairbanks[P]TidaLink/oscpack/osc/OscReceivedElements.cpp"
                    ,0x2ce,
                    "void osc::ReceivedMessage::Init(const char *, osc_bundle_element_size_t)");
    }
    if (0x7fffffff < lVar5) {
      __assert_fail("argumentCount <= OSC_INT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/efairbanks[P]TidaLink/oscpack/osc/OscReceivedElements.cpp"
                    ,0x2cf,
                    "void osc::ReceivedMessage::Init(const char *, osc_bundle_element_size_t)");
    }
  }
  return;
}

Assistant:

void ReceivedMessage::Init( const char *message, osc_bundle_element_size_t size )
{
    if( !IsValidElementSizeValue(size) )
        throw MalformedMessageException( "invalid message size" );

    if( size == 0 )
        throw MalformedMessageException( "zero length messages not permitted" );

    if( !IsMultipleOf4(size) )
        throw MalformedMessageException( "message size must be multiple of four" );

    const char *end = message + size;

    typeTagsBegin_ = FindStr4End( addressPattern_, end );
    if( typeTagsBegin_ == 0 ){
        // address pattern was not terminated before end
        throw MalformedMessageException( "unterminated address pattern" );
    }

    if( typeTagsBegin_ == end ){
        // message consists of only the address pattern - no arguments or type tags.
        typeTagsBegin_ = 0;
        typeTagsEnd_ = 0;
        arguments_ = 0;
            
    }else{
        if( *typeTagsBegin_ != ',' )
            throw MalformedMessageException( "type tags not present" );

        if( *(typeTagsBegin_ + 1) == '\0' ){
            // zero length type tags
            typeTagsBegin_ = 0;
            typeTagsEnd_ = 0;
            arguments_ = 0;

        }else{
            // check that all arguments are present and well formed
                
            arguments_ = FindStr4End( typeTagsBegin_, end );
            if( arguments_ == 0 ){
                throw MalformedMessageException( "type tags were not terminated before end of message" );
            }

            ++typeTagsBegin_; // advance past initial ','
            
            const char *typeTag = typeTagsBegin_;
            const char *argument = arguments_;
            unsigned int arrayLevel = 0;
                        
            do{
                switch( *typeTag ){
                    case TRUE_TYPE_TAG:
                    case FALSE_TYPE_TAG:
                    case NIL_TYPE_TAG:
                    case INFINITUM_TYPE_TAG:
                        // zero length
                        break;

                    //    [ Indicates the beginning of an array. The tags following are for
                    //        data in the Array until a close brace tag is reached.
                    //    ] Indicates the end of an array.
                    case ARRAY_BEGIN_TYPE_TAG:
                        ++arrayLevel;
                        // (zero length argument data)
                        break;

                    case ARRAY_END_TYPE_TAG:
                        --arrayLevel;
                        // (zero length argument data)
                        break;

                    case INT32_TYPE_TAG:
                    case FLOAT_TYPE_TAG:
                    case CHAR_TYPE_TAG:
                    case RGBA_COLOR_TYPE_TAG:
                    case MIDI_MESSAGE_TYPE_TAG:

                        if( argument == end )
                            throw MalformedMessageException( "arguments exceed message size" );
                        argument += 4;
                        if( argument > end )
                            throw MalformedMessageException( "arguments exceed message size" );
                        break;

                    case INT64_TYPE_TAG:
                    case TIME_TAG_TYPE_TAG:
                    case DOUBLE_TYPE_TAG:

                        if( argument == end )
                            throw MalformedMessageException( "arguments exceed message size" );
                        argument += 8;
                        if( argument > end )
                            throw MalformedMessageException( "arguments exceed message size" );
                        break;

                    case STRING_TYPE_TAG: 
                    case SYMBOL_TYPE_TAG:
                    
                        if( argument == end )
                            throw MalformedMessageException( "arguments exceed message size" );
                        argument = FindStr4End( argument, end );
                        if( argument == 0 )
                            throw MalformedMessageException( "unterminated string argument" );
                        break;

                    case BLOB_TYPE_TAG:
                        {
                            if( argument + osc::OSC_SIZEOF_INT32 > end )
                                MalformedMessageException( "arguments exceed message size" );
                                
                            // treat blob size as an unsigned int for the purposes of this calculation
                            uint32 blobSize = ToUInt32( argument );
                            argument = argument + osc::OSC_SIZEOF_INT32 + RoundUp4( blobSize );
                            if( argument > end )
                                MalformedMessageException( "arguments exceed message size" );
                        }
                        break;
                        
                    default:
                        throw MalformedMessageException( "unknown type tag" );
                }

            }while( *++typeTag != '\0' );
            typeTagsEnd_ = typeTag;

            if( arrayLevel !=  0 )
                throw MalformedMessageException( "array was not terminated before end of message (expected ']' end of array tag)" );
        }

        // These invariants should be guaranteed by the above code.
        // we depend on them in the implementation of ArgumentCount()
#ifndef NDEBUG
        std::ptrdiff_t argumentCount = typeTagsEnd_ - typeTagsBegin_;
        assert( argumentCount >= 0 );
        assert( argumentCount <= OSC_INT32_MAX );
#endif
    }
}